

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

void __thiscall
QMenuPrivate::copyActionToPlatformItem(QMenuPrivate *this,QAction *action,QPlatformMenuItem *item)

{
  undefined1 uVar1;
  char cVar2;
  undefined4 uVar3;
  QStyle *pQVar4;
  long lVar5;
  long lVar6;
  QPlatformMenu *menu;
  undefined8 uVar7;
  long in_FS_OFFSET;
  QStyleOption opt;
  undefined1 local_78 [16];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QAction::text();
  (**(code **)(*(long *)item + 0x70))(item,local_78);
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_78._0_8_ = *(int *)local_78._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_78._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  uVar1 = QAction::isSeparator();
  (**(code **)(*(long *)item + 0x90))(item,uVar1);
  cVar2 = QAction::isIconVisibleInMenu();
  if (cVar2 == '\0') {
    QIcon::QIcon((QIcon *)local_78);
    (**(code **)(*(long *)item + 0x78))(item,local_78);
    QIcon::~QIcon((QIcon *)local_78);
  }
  else {
    QAction::icon();
    (**(code **)(*(long *)item + 0x78))(item,local_78);
    QIcon::~QIcon((QIcon *)local_78);
    do {
      action = *(QAction **)(*(long *)&((QWidget *)action)->field_0x8 + 0x10);
      if ((QWidget *)action == (QWidget *)0x0) goto LAB_0045cc8c;
    } while ((*(byte *)(*(long *)&((QWidget *)action)->field_0x8 + 0x30) & 1) == 0);
    if ((QWidget *)action == (QWidget *)0x0) {
LAB_0045cc8c:
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOption::QStyleOption((QStyleOption *)local_78,1,0);
      pQVar4 = QApplication::style();
      uVar3 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x3e,local_78,0);
      (**(code **)(*(long *)item + 200))(item,uVar3);
    }
    else {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOption::QStyleOption((QStyleOption *)local_78,1,0);
      QStyleOption::initFrom((QStyleOption *)local_78,(QWidget *)action);
      pQVar4 = QWidget::style((QWidget *)action);
      uVar3 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x3e,local_78,action);
      (**(code **)(*(long *)item + 200))(item,uVar3);
    }
    QStyleOption::~QStyleOption((QStyleOption *)local_78);
  }
  uVar1 = QAction::isVisible();
  (**(code **)(*(long *)item + 0x88))(item,uVar1);
  QAction::shortcut();
  (**(code **)(*(long *)item + 0xb8))(item,local_78);
  QKeySequence::~QKeySequence((QKeySequence *)local_78);
  uVar1 = QAction::isCheckable();
  (**(code **)(*(long *)item + 0xa8))(item,uVar1);
  uVar1 = QAction::isChecked();
  (**(code **)(*(long *)item + 0xb0))(item,uVar1);
  lVar5 = QAction::actionGroup();
  if (lVar5 == 0) {
    uVar1 = 0;
  }
  else {
    QAction::actionGroup();
    uVar1 = QActionGroup::isExclusive();
  }
  (**(code **)(*(long *)item + 0xd8))(item,uVar1);
  QAction::font();
  (**(code **)(*(long *)item + 0x98))(item,local_78);
  QFont::~QFont((QFont *)local_78);
  uVar3 = QAction::menuRole();
  (**(code **)(*(long *)item + 0xa0))(item,uVar3);
  uVar1 = QAction::isEnabled();
  (**(code **)(*(long *)item + 0xc0))(item,uVar1);
  QAction::menuObject();
  lVar5 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
  if (lVar5 != 0) {
    QAction::menuObject();
    lVar6 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
    lVar5 = *(long *)(*(long *)(lVar6 + 8) + 0x3b8);
    if (((lVar5 == 0) || (*(int *)(lVar5 + 4) == 0)) ||
       (*(long *)(*(long *)(lVar6 + 8) + 0x3c0) == 0)) {
      QAction::menuObject();
      lVar5 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
      menu = (QPlatformMenu *)(**(code **)(*(long *)(this->platformMenu).wp.value + 0xf8))();
      setPlatformMenu(*(QMenuPrivate **)(lVar5 + 8),menu);
      syncPlatformMenu(*(QMenuPrivate **)(lVar5 + 8));
    }
    QAction::menuObject();
    lVar6 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
    lVar5 = *(long *)(*(long *)(lVar6 + 8) + 0x3b8);
    if ((lVar5 != 0) && (*(int *)(lVar5 + 4) != 0)) {
      uVar7 = *(undefined8 *)(*(long *)(lVar6 + 8) + 0x3c0);
      goto LAB_0045ceb6;
    }
  }
  uVar7 = 0;
LAB_0045ceb6:
  (**(code **)(*(long *)item + 0x80))(item,uVar7);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuPrivate::copyActionToPlatformItem(const QAction *action, QPlatformMenuItem *item)
{
    item->setText(action->text());
    item->setIsSeparator(action->isSeparator());
    if (action->isIconVisibleInMenu()) {
        item->setIcon(action->icon());
        if (QWidget *w = getParentWidget(action)) {
            QStyleOption opt;
            opt.initFrom(w);
            item->setIconSize(w->style()->pixelMetric(QStyle::PM_SmallIconSize, &opt, w));
        } else {
            QStyleOption opt;
            item->setIconSize(QApplication::style()->pixelMetric(QStyle::PM_SmallIconSize, &opt, nullptr));
        }
    } else {
        item->setIcon(QIcon());
    }
    item->setVisible(action->isVisible());
#if QT_CONFIG(shortcut)
    item->setShortcut(action->shortcut());
#endif
    item->setCheckable(action->isCheckable());
    item->setChecked(action->isChecked());
    item->setHasExclusiveGroup(action->actionGroup() && action->actionGroup()->isExclusive());
    item->setFont(action->font());
    item->setRole((QPlatformMenuItem::MenuRole) action->menuRole());
    item->setEnabled(action->isEnabled());

    if (action->menu()) {
        if (!action->menu()->platformMenu())
            action->menu()->setPlatformMenu(platformMenu->createSubMenu());
        item->setMenu(action->menu()->platformMenu());
    } else {
        item->setMenu(nullptr);
    }
}